

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::ReadAgents(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  FactoredDecPOMDPDiscrete *this_00;
  int iVar2;
  xmlXPathObjectPtr pxVar3;
  int i;
  long lVar4;
  char *this_01;
  
  this_01 = "/ProbModelXML/ProbNet/Agents/Agent";
  pxVar3 = GetNodesMatchingExpression
                     (this,(xmlChar *)"/ProbModelXML/ProbNet/Agents/Agent",(xmlNodePtr)0x0);
  if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (this->_m_asynchronousModel == false)) {
    pxVar1 = pxVar3->nodesetval;
    iVar2 = pxVar1->nodeNr;
    if (1 < iVar2) {
      for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
        this_00 = this->_m_fDecPOMDP;
        GetVariableName_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,(ParserProbModelXML *)this_01,
                   pxVar1->nodeTab[lVar4]);
        this_01 = (char *)&stack0xffffffffffffffb0;
        MultiAgentDecisionProcess::AddAgent
                  ((MultiAgentDecisionProcess *)this_00,(string *)&stack0xffffffffffffffb0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
        iVar2 = pxVar1->nodeNr;
      }
      goto LAB_0049cf16;
    }
  }
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this->_m_fDecPOMDP,1);
LAB_0049cf16:
  xmlXPathFreeObject(pxVar3);
  this->_m_agentsInitialized = true;
  return;
}

Assistant:

void ParserProbModelXML::ReadAgents()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Agents/Agent";
    xmlXPathObjectPtr agent_nodes = GetNodesMatchingExpression(xpath);

    if (_m_asynchronousModel || agent_nodes == NULL || agent_nodes->nodesetval->nodeNr < 2){
        _m_fDecPOMDP->SetNrAgents(1);
        xmlXPathFreeObject (agent_nodes);
        _m_agentsInitialized = true;
        return;
    }
    xmlNodeSetPtr nodeset = agent_nodes->nodesetval;
    for (int i = 0; i < nodeset->nodeNr; i++) {
      _m_fDecPOMDP->AddAgent(GetVariableName(nodeset->nodeTab[i]));
    }
    xmlXPathFreeObject (agent_nodes);
    _m_agentsInitialized = true;
    return;
}